

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceFinder.cc
# Opt level: O3

void __thiscall
ResourceFinder::handleObject
          (ResourceFinder *this,QPDFObjectHandle *obj,size_t offset,size_t param_3)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *this_00;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_01;
  long lVar4;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string resource_type;
  string op;
  allocator_type local_2c1;
  key_type local_2c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  bVar1 = QPDFObjectHandle::isOperator(obj);
  if ((bVar1) && ((this->last_name)._M_string_length != 0)) {
    if (handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::op_to_rtype_abi_cxx11_ == '\0')
    {
      iVar2 = __cxa_guard_acquire(&handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::
                                   op_to_rtype_abi_cxx11_);
      if (iVar2 != 0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[3],_const_char_(&)[12],_true>
                  (local_2a0,(char (*) [3])0x279a59,(char (*) [12])"/ColorSpace");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[3],_const_char_(&)[12],_true>
                  (local_2a0 + 1,(char (*) [3])"cs",(char (*) [12])"/ColorSpace");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[3],_const_char_(&)[11],_true>
                  (local_2a0 + 2,(char (*) [3])0x25fdca,(char (*) [11])"/ExtGState");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[3],_const_char_(&)[6],_true>
                  (local_2a0 + 3,(char (*) [3])"Tf",(char (*) [6])"/Font");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[4],_const_char_(&)[9],_true>
                  (&local_1a0,(char (*) [4])"SCN",(char (*) [9])"/Pattern");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[4],_const_char_(&)[9],_true>
                  (&local_160,(char (*) [4])"scn",(char (*) [9])"/Pattern");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[4],_const_char_(&)[12],_true>
                  (&local_120,(char (*) [4])"BDC",(char (*) [12])"/Properties");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[3],_const_char_(&)[12],_true>
                  (&local_e0,(char (*) [3])0x279a65,(char (*) [12])"/Properties");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[3],_const_char_(&)[9],_true>
                  (&local_a0,(char (*) [3])0x26b59a,(char (*) [9])"/Shading");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[3],_const_char_(&)[9],_true>
                  (&local_60,(char (*) [3])"Do",(char (*) [9])"/XObject");
        __l._M_len = 10;
        __l._M_array = local_2a0;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map(&handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::op_to_rtype_abi_cxx11_,
              __l,(less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2c0,&local_2c1);
        lVar4 = 0x240;
        do {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&local_2a0[0].first._M_dataplus._M_p + lVar4));
          lVar4 = lVar4 + -0x40;
        } while (lVar4 != -0x40);
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::~map,&handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::
                             op_to_rtype_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::
                             op_to_rtype_abi_cxx11_);
      }
    }
    QPDFObjectHandle::getOperatorValue_abi_cxx11_(&local_2a0[0].first,obj);
    local_2c0._M_string_length = 0;
    local_2c0.field_2._M_local_buf[0] = '\0';
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::
                    op_to_rtype_abi_cxx11_._M_t,&local_2a0[0].first);
    if ((_Rb_tree_header *)iVar3._M_node !=
        &handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::op_to_rtype_abi_cxx11_._M_t.
         _M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)&local_2c0);
    }
    if (local_2c0._M_string_length != 0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->names,&this->last_name);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                ::operator[](&this->names_by_resource_type,&local_2c0);
      this_01 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                   ::operator[](this_00,&this->last_name);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>(this_01,&this->last_name_offset);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,
                      CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                               local_2c0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0[0].first._M_dataplus._M_p != &local_2a0[0].first.field_2) {
      operator_delete(local_2a0[0].first._M_dataplus._M_p,
                      local_2a0[0].first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = QPDFObjectHandle::isName(obj);
    if (bVar1) {
      QPDFObjectHandle::getName_abi_cxx11_(&local_2a0[0].first,obj);
      std::__cxx11::string::operator=((string *)&this->last_name,(string *)local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0[0].first._M_dataplus._M_p != &local_2a0[0].first.field_2) {
        operator_delete(local_2a0[0].first._M_dataplus._M_p,
                        local_2a0[0].first.field_2._M_allocated_capacity + 1);
      }
      this->last_name_offset = offset;
    }
  }
  return;
}

Assistant:

void
ResourceFinder::handleObject(QPDFObjectHandle obj, size_t offset, size_t)
{
    if (obj.isOperator() && (!this->last_name.empty())) {
        static std::map<std::string, std::string> op_to_rtype = {
            {"CS", "/ColorSpace"},
            {"cs", "/ColorSpace"},
            {"gs", "/ExtGState"},
            {"Tf", "/Font"},
            {"SCN", "/Pattern"},
            {"scn", "/Pattern"},
            {"BDC", "/Properties"},
            {"DP", "/Properties"},
            {"sh", "/Shading"},
            {"Do", "/XObject"},
        };
        std::string op = obj.getOperatorValue();
        std::string resource_type;
        auto iter = op_to_rtype.find(op);
        if (iter != op_to_rtype.end()) {
            resource_type = iter->second;
        }
        if (!resource_type.empty()) {
            this->names.insert(this->last_name);
            this->names_by_resource_type[resource_type][this->last_name].insert(
                this->last_name_offset);
        }
    } else if (obj.isName()) {
        this->last_name = obj.getName();
        this->last_name_offset = offset;
    }
}